

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

void __thiscall mpt::reference<mpt::layout::line>::type::type(type *this,uintptr_t initial)

{
  uintptr_t initial_local;
  type *this_local;
  
  layout::line::line(&this->super_line,(line *)0x0);
  (this->super_line).super_metatype.super_convertable._vptr_convertable =
       (_func_int **)&PTR_convert_0017c738;
  (this->super_line).super_object._vptr_object = (_func_int **)&PTR_property_0017c788;
  refcount::refcount(&this->_ref,initial);
  return;
}

Assistant:

type(uintptr_t initial = 1) : _ref(initial)
		{ }